

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string_view name,Symbol symbol)

{
  ctrl_t *pcVar1;
  long lVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  *this_00;
  uint uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  anon_union_8_1_a8a14541_for_iterator_2 aVar23;
  HeapOrSoo *pHVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  anon_union_8_1_a8a14541_for_iterator_2 aVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  bool bVar42;
  ushort uVar43;
  int iVar44;
  Symbol *key;
  anon_union_8_1_a8a14541_for_iterator_2 aVar45;
  size_t sVar46;
  slot_type *psVar47;
  HeapOrSoo *pHVar48;
  size_t __n;
  Symbol *b;
  Symbol *b_00;
  Symbol *b_01;
  Symbol *b_02;
  size_t cap_1;
  ulong uVar49;
  Symbol *pSVar50;
  anon_union_8_1_a8a14541_for_iterator_2 aVar51;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  *prVar52;
  PolicyFunctions *in_R9;
  uint uVar53;
  size_t cap_4;
  Symbol *key_1;
  ctrl_t *pcVar54;
  ulong uVar55;
  iterator *piVar56;
  size_type __rlen;
  undefined4 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i match;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  FindInfo target;
  iterator iVar64;
  iterator iVar65;
  Symbol local_c8;
  iterator *local_c0;
  ctrl_t *local_b8;
  anon_union_8_1_a8a14541_for_iterator_2 local_b0;
  undefined8 local_a8;
  ctrl_t cStack_a0;
  ctrl_t cStack_9f;
  ctrl_t cStack_9e;
  ctrl_t cStack_9d;
  ctrl_t cStack_9c;
  ctrl_t cStack_9b;
  ctrl_t cStack_9a;
  ctrl_t cStack_99;
  undefined1 local_98 [16];
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_80;
  size_t local_68;
  char *local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  
  __n = name._M_len;
  local_c8.ptr_ = symbol.ptr_;
  local_68 = __n;
  local_60 = name._M_str;
  Symbol::parent_name_key(&local_80,&local_c8);
  if ((local_80.second._M_len == __n) &&
     ((__n == 0 || (iVar44 = bcmp(name._M_str,local_80.second._M_str,__n), iVar44 == 0)))) {
    Symbol::parent_name_key(&local_80,&local_c8);
    if (local_80.first == parent) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertOnFind<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,&local_c8);
      prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 *)(this->symbols_by_parent_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
      if (prVar52 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
           *)0x1) {
        if ((this->symbols_by_parent_).
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_ < 2) {
          absl::lts_20250127::container_internal::CommonFields::AssertInSooMode
                    ((CommonFields *)this);
          (this->symbols_by_parent_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_ = 2;
          aVar45.slot_ = absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                     *)this);
          iVar64.field_1.slot_ = aVar45.slot_;
          iVar64.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
        }
        else {
          psVar47 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
          bVar42 = (anonymous_namespace)::SymbolByParentEq::operator()(psVar47,&local_c8,b_00);
          if (bVar42) {
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
            return false;
          }
          pSVar50 = (Symbol *)0x3;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::resize_impl(this);
          sVar46 = (anonymous_namespace)::SymbolByParentHash::operator()
                             ((SymbolByParentHash *)&local_c8,pSVar50);
          sVar46 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                             (sVar46,8,(CommonFields *)this);
LAB_00154a4c:
          iVar64 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                  *)this,sVar46);
        }
        aVar45 = iVar64.field_1;
        piVar56 = (iterator *)iVar64.ctrl_;
        sVar46 = (this->symbols_by_parent_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        (this->symbols_by_parent_).
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ = 0xffffffffffffff9c;
        (aVar45.slot_)->ptr_ = local_c8.ptr_;
        absl::lts_20250127::container_internal::CommonFields::set_capacity
                  ((CommonFields *)this,sVar46);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::iterator::operator*(piVar56);
        aVar51 = aVar45;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::AssertOnFind<google::protobuf::Symbol>
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this,aVar45.slot_);
        prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   *)(this->symbols_by_parent_).
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.capacity_;
        if (prVar52 ==
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             *)0x1) {
          prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)0x1;
          if (1 < (this->symbols_by_parent_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.size_) {
            psVar47 = absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                  *)this);
            bVar42 = (anonymous_namespace)::SymbolByParentEq::operator()(psVar47,aVar45.slot_,b_02);
            if (bVar42) {
              aVar45.slot_ = absl::lts_20250127::container_internal::
                             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                             ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                         *)this);
              iVar65.field_1.slot_ = aVar45.slot_;
              iVar65.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
              goto LAB_00154c66;
            }
            prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       *)(this->symbols_by_parent_).
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.capacity_;
            aVar51 = aVar45;
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::AssertNotDebugCapacity(prVar52);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = aVar51;
          iVar65 = (iterator)(auVar6 << 0x40);
LAB_00154c66:
          bVar42 = absl::lts_20250127::container_internal::operator==
                             ((const_iterator *)iVar65.ctrl_,(const_iterator *)iVar65.field_1.slot_)
          ;
          if (!bVar42) {
            __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xfe2,
                          "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                         );
          }
          return true;
        }
        pHVar24 = local_a8;
        if (prVar52 !=
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             *)0x0) {
          aVar51 = (anon_union_8_1_a8a14541_for_iterator_2)
                   ((anon_union_8_1_a8a14541_for_iterator_2 *)
                   &(this->symbols_by_parent_).
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_)->slot_;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::prefetch_heap_block(prVar52);
          sVar46 = (anonymous_namespace)::SymbolByParentHash::operator()
                             ((SymbolByParentHash *)aVar45.slot_,aVar51.slot_);
          prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)(this->symbols_by_parent_).
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.capacity_;
          if (prVar52 ==
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               *)0x1) {
            __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe2a,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                         );
          }
          pHVar24 = local_a8;
          if (prVar52 !=
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               *)0x0) {
            local_c0 = piVar56;
            if (((ulong)((long)&(prVar52->settings_).
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.capacity_ + 1U) & (ulong)prVar52) != 0) goto LAB_00154cdf;
            pcVar54 = (this->symbols_by_parent_).
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      .settings_.
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      .value.heap_or_soo_.heap.control;
            uVar55 = sVar46 >> 7 ^ (ulong)pcVar54 >> 0xc;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::control(prVar52);
            auVar58 = ZEXT216(CONCAT11((char)sVar46,(char)sVar46) & 0x7f7f);
            auVar58 = pshuflw(auVar58,auVar58,0);
            uVar57 = auVar58._0_4_;
            auVar61._4_4_ = uVar57;
            auVar61._0_4_ = uVar57;
            auVar61._8_4_ = uVar57;
            auVar61._12_4_ = uVar57;
            pHVar48 = (HeapOrSoo *)0x0;
            local_b8 = pcVar54;
            while( true ) {
              uVar55 = uVar55 & (ulong)prVar52;
              pcVar54 = local_b8 + uVar55;
              auVar60[0] = -(auVar61[0] == *pcVar54);
              auVar60[1] = -(auVar61[1] == pcVar54[1]);
              auVar60[2] = -(auVar61[2] == pcVar54[2]);
              auVar60[3] = -(auVar61[3] == pcVar54[3]);
              auVar60[4] = -(auVar61[4] == pcVar54[4]);
              auVar60[5] = -(auVar61[5] == pcVar54[5]);
              auVar60[6] = -(auVar61[6] == pcVar54[6]);
              auVar60[7] = -(auVar61[7] == pcVar54[7]);
              auVar60[8] = -(auVar61[8] == pcVar54[8]);
              auVar60[9] = -(auVar61[9] == pcVar54[9]);
              auVar60[10] = -(auVar61[10] == pcVar54[10]);
              auVar60[0xb] = -(auVar61[0xb] == pcVar54[0xb]);
              auVar60[0xc] = -(auVar61[0xc] == pcVar54[0xc]);
              auVar60[0xd] = -(auVar61[0xd] == pcVar54[0xd]);
              auVar60[0xe] = -(auVar61[0xe] == pcVar54[0xe]);
              auVar60[0xf] = -(auVar61[0xf] == pcVar54[0xf]);
              uVar43 = (ushort)(SUB161(auVar60 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar60[0xf] >> 7) << 0xf;
              uVar53 = (uint)uVar43;
              aVar33 = aVar45;
              cVar25 = *pcVar54;
              cVar26 = pcVar54[1];
              cVar27 = pcVar54[2];
              cVar28 = pcVar54[3];
              cVar29 = pcVar54[4];
              cVar30 = pcVar54[5];
              cVar31 = pcVar54[6];
              cVar32 = pcVar54[7];
              cVar34 = pcVar54[8];
              cVar35 = pcVar54[9];
              cVar36 = pcVar54[10];
              cVar37 = pcVar54[0xb];
              cVar38 = pcVar54[0xc];
              cVar39 = pcVar54[0xd];
              cVar40 = pcVar54[0xe];
              cVar41 = pcVar54[0xf];
              aVar23 = local_b0;
              pHVar24 = local_a8;
              cVar7 = local_58;
              cVar8 = cStack_57;
              cVar9 = cStack_56;
              cVar10 = cStack_55;
              cVar11 = cStack_54;
              cVar12 = cStack_53;
              cVar13 = cStack_52;
              cVar14 = cStack_51;
              cVar15 = cStack_50;
              cVar16 = cStack_4f;
              cVar17 = cStack_4e;
              cVar18 = cStack_4d;
              cVar19 = cStack_4c;
              cVar20 = cStack_4b;
              cVar21 = cStack_4a;
              cVar22 = cStack_49;
              while (cStack_49 = cVar41, cStack_4a = cVar40, cStack_4b = cVar39, cStack_4c = cVar38,
                    cStack_4d = cVar37, cStack_4e = cVar36, cStack_4f = cVar35, cStack_50 = cVar34,
                    cStack_51 = cVar32, cStack_52 = cVar31, cStack_53 = cVar30, cStack_54 = cVar29,
                    cStack_55 = cVar28, cStack_56 = cVar27, cStack_57 = cVar26, local_58 = cVar25,
                    local_b0 = aVar33, local_a8 = pHVar48, uVar43 != 0) {
                uVar3 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                  }
                }
                uVar49 = uVar3 + uVar55 & (ulong)prVar52;
                lVar2 = *(long *)((long)&(this->symbols_by_parent_).
                                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                         .settings_.
                                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                         .
                                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                         .value.heap_or_soo_ + 8);
                local_98 = auVar61;
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                              *)(this->symbols_by_parent_).
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                .settings_.
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.capacity_);
                aVar45 = local_b0;
                aVar51 = local_b0;
                bVar42 = (anonymous_namespace)::SymbolByParentEq::operator()
                                   ((void *)(uVar49 * 8 + lVar2),local_b0.slot_,b_01);
                if (bVar42) {
                  iVar65 = absl::lts_20250127::container_internal::
                           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                          *)this,uVar49);
                  goto LAB_00154c66;
                }
                uVar43 = (ushort)(uVar53 - 1) & (ushort)uVar53;
                uVar53 = CONCAT22((short)(uVar53 - 1 >> 0x10),uVar43);
                pHVar48 = local_a8;
                aVar33 = local_b0;
                auVar61 = local_98;
                cVar25 = local_58;
                cVar26 = cStack_57;
                cVar27 = cStack_56;
                cVar28 = cStack_55;
                cVar29 = cStack_54;
                cVar30 = cStack_53;
                cVar31 = cStack_52;
                cVar32 = cStack_51;
                cVar34 = cStack_50;
                cVar35 = cStack_4f;
                cVar36 = cStack_4e;
                cVar37 = cStack_4d;
                cVar38 = cStack_4c;
                cVar39 = cStack_4b;
                cVar40 = cStack_4a;
                cVar41 = cStack_49;
                aVar23 = local_b0;
                pHVar24 = local_a8;
                cVar7 = local_58;
                cVar8 = cStack_57;
                cVar9 = cStack_56;
                cVar10 = cStack_55;
                cVar11 = cStack_54;
                cVar12 = cStack_53;
                cVar13 = cStack_52;
                cVar14 = cStack_51;
                cVar15 = cStack_50;
                cVar16 = cStack_4f;
                cVar17 = cStack_4e;
                cVar18 = cStack_4d;
                cVar19 = cStack_4c;
                cVar20 = cStack_4b;
                cVar21 = cStack_4a;
                cVar22 = cStack_49;
              }
              auVar63[0] = -(local_58 == kEmpty);
              auVar63[1] = -(cStack_57 == kEmpty);
              auVar63[2] = -(cStack_56 == kEmpty);
              auVar63[3] = -(cStack_55 == kEmpty);
              auVar63[4] = -(cStack_54 == kEmpty);
              auVar63[5] = -(cStack_53 == kEmpty);
              auVar63[6] = -(cStack_52 == kEmpty);
              auVar63[7] = -(cStack_51 == kEmpty);
              auVar63[8] = -(cStack_50 == kEmpty);
              auVar63[9] = -(cStack_4f == kEmpty);
              auVar63[10] = -(cStack_4e == kEmpty);
              auVar63[0xb] = -(cStack_4d == kEmpty);
              auVar63[0xc] = -(cStack_4c == kEmpty);
              auVar63[0xd] = -(cStack_4b == kEmpty);
              auVar63[0xe] = -(cStack_4a == kEmpty);
              auVar63[0xf] = -(cStack_49 == kEmpty);
              this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         *)(this->symbols_by_parent_).
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           .settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.capacity_;
              local_b0 = aVar23;
              local_58 = cVar7;
              cStack_57 = cVar8;
              cStack_56 = cVar9;
              cStack_55 = cVar10;
              cStack_54 = cVar11;
              cStack_53 = cVar12;
              cStack_52 = cVar13;
              cStack_51 = cVar14;
              cStack_50 = cVar15;
              cStack_4f = cVar16;
              cStack_4e = cVar17;
              cStack_4d = cVar18;
              cStack_4c = cVar19;
              cStack_4b = cVar20;
              cStack_4a = cVar21;
              if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar63 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar63 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  cStack_49 == kEmpty) break;
              cStack_49 = cVar22;
              if (this_00 ==
                  (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   *)0x0) goto LAB_00154cc0;
              uVar55 = (long)local_a8 + uVar55 + 0x10;
              pHVar48 = local_a8 + 1;
              local_a8 = pHVar24;
              if (this_00 < pHVar48) {
                __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0xe37,
                              "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                             );
              }
            }
            local_a8 = pHVar24;
            cStack_49 = cVar22;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::AssertNotDebugCapacity(this_00);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = aVar51;
            iVar65 = (iterator)(auVar5 << 0x40);
            goto LAB_00154c66;
          }
        }
      }
      else {
        pHVar24 = local_a8;
        if (prVar52 !=
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             *)0x0) {
          pSVar50 = (Symbol *)
                    (this->symbols_by_parent_).
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::prefetch_heap_block(prVar52);
          aVar45 = (anon_union_8_1_a8a14541_for_iterator_2)
                   (anonymous_namespace)::SymbolByParentHash::operator()
                             ((SymbolByParentHash *)&local_c8,pSVar50);
          prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)(this->symbols_by_parent_).
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.capacity_;
          if (((ulong)((long)&(prVar52->settings_).
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                              .value.capacity_ + 1U) & (ulong)prVar52) == 0) {
            pcVar54 = (this->symbols_by_parent_).
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      .settings_.
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      .value.heap_or_soo_.heap.control;
            uVar55 = (ulong)aVar45.slot_ >> 7 ^ (ulong)pcVar54 >> 0xc;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::control(prVar52);
            auVar58 = ZEXT216(CONCAT11(aVar45._0_1_,aVar45._0_1_) & 0x7f7f);
            auVar58 = pshuflw(auVar58,auVar58,0);
            uVar57 = auVar58._0_4_;
            auVar58._4_4_ = uVar57;
            auVar58._0_4_ = uVar57;
            auVar58._8_4_ = uVar57;
            auVar58._12_4_ = uVar57;
            local_c0 = (iterator *)0x0;
            local_b0 = aVar45;
LAB_0015487b:
            uVar55 = uVar55 & (ulong)prVar52;
            pcVar1 = pcVar54 + uVar55;
            auVar59[0] = -(auVar58[0] == *pcVar1);
            auVar59[1] = -(auVar58[1] == pcVar1[1]);
            auVar59[2] = -(auVar58[2] == pcVar1[2]);
            auVar59[3] = -(auVar58[3] == pcVar1[3]);
            auVar59[4] = -(auVar58[4] == pcVar1[4]);
            auVar59[5] = -(auVar58[5] == pcVar1[5]);
            auVar59[6] = -(auVar58[6] == pcVar1[6]);
            auVar59[7] = -(auVar58[7] == pcVar1[7]);
            auVar59[8] = -(auVar58[8] == pcVar1[8]);
            auVar59[9] = -(auVar58[9] == pcVar1[9]);
            auVar59[10] = -(auVar58[10] == pcVar1[10]);
            auVar59[0xb] = -(auVar58[0xb] == pcVar1[0xb]);
            auVar59[0xc] = -(auVar58[0xc] == pcVar1[0xc]);
            auVar59[0xd] = -(auVar58[0xd] == pcVar1[0xd]);
            auVar59[0xe] = -(auVar58[0xe] == pcVar1[0xe]);
            auVar59[0xf] = -(auVar58[0xf] == pcVar1[0xf]);
            uVar43 = (ushort)(SUB161(auVar59 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar59[0xf] >> 7) << 0xf;
            uVar53 = (uint)uVar43;
            cVar7 = *pcVar1;
            cVar8 = pcVar1[1];
            cVar9 = pcVar1[2];
            cVar10 = pcVar1[3];
            cVar11 = pcVar1[4];
            cVar12 = pcVar1[5];
            cVar13 = pcVar1[6];
            cVar14 = pcVar1[7];
            cVar25 = pcVar1[8];
            cVar26 = pcVar1[9];
            cVar27 = pcVar1[10];
            cVar28 = pcVar1[0xb];
            cVar29 = pcVar1[0xc];
            cVar30 = pcVar1[0xd];
            cVar31 = pcVar1[0xe];
            cVar32 = pcVar1[0xf];
            pHVar24 = local_a8;
            cVar15 = cStack_a0;
            cVar16 = cStack_9f;
            cVar17 = cStack_9e;
            cVar18 = cStack_9d;
            cVar19 = cStack_9c;
            cVar20 = cStack_9b;
            cVar21 = cStack_9a;
            cVar22 = cStack_99;
            local_a8 = *(HeapOrSoo **)pcVar1;
            while (cStack_99 = cVar32, cStack_9a = cVar31, cStack_9b = cVar30, cStack_9c = cVar29,
                  cStack_9d = cVar28, cStack_9e = cVar27, cStack_9f = cVar26, cStack_a0 = cVar25,
                  uVar43 != 0) {
              uVar3 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              uVar49 = uVar3 + uVar55 & (ulong)prVar52;
              lVar2 = *(long *)((long)&(this->symbols_by_parent_).
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8);
              local_b8 = pcVar54;
              local_98 = auVar58;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            *)(this->symbols_by_parent_).
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                              .settings_.
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                              .value.capacity_);
              bVar42 = (anonymous_namespace)::SymbolByParentEq::operator()
                                 ((void *)(uVar49 * 8 + lVar2),&local_c8,b);
              if (bVar42) {
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                               *)this,uVar49);
                return false;
              }
              uVar43 = (ushort)(uVar53 - 1) & (ushort)uVar53;
              uVar53 = CONCAT22((short)(uVar53 - 1 >> 0x10),uVar43);
              pcVar54 = local_b8;
              auVar58 = local_98;
              cVar7 = (ctrl_t)local_a8;
              cVar8 = local_a8._1_1_;
              cVar9 = local_a8._2_1_;
              cVar10 = local_a8._3_1_;
              cVar11 = local_a8._4_1_;
              cVar12 = local_a8._5_1_;
              cVar13 = local_a8._6_1_;
              cVar14 = local_a8._7_1_;
              cVar25 = cStack_a0;
              cVar26 = cStack_9f;
              cVar27 = cStack_9e;
              cVar28 = cStack_9d;
              cVar29 = cStack_9c;
              cVar30 = cStack_9b;
              cVar31 = cStack_9a;
              cVar32 = cStack_99;
              pHVar24 = local_a8;
              cVar15 = cStack_a0;
              cVar16 = cStack_9f;
              cVar17 = cStack_9e;
              cVar18 = cStack_9d;
              cVar19 = cStack_9c;
              cVar20 = cStack_9b;
              cVar21 = cStack_9a;
              cVar22 = cStack_99;
            }
            auVar62[0] = -(cVar7 == kEmpty);
            auVar62[1] = -(cVar8 == kEmpty);
            auVar62[2] = -(cVar9 == kEmpty);
            auVar62[3] = -(cVar10 == kEmpty);
            auVar62[4] = -(cVar11 == kEmpty);
            auVar62[5] = -(cVar12 == kEmpty);
            auVar62[6] = -(cVar13 == kEmpty);
            auVar62[7] = -(cVar14 == kEmpty);
            auVar62[8] = -(cStack_a0 == kEmpty);
            auVar62[9] = -(cStack_9f == kEmpty);
            auVar62[10] = -(cStack_9e == kEmpty);
            auVar62[0xb] = -(cStack_9d == kEmpty);
            auVar62[0xc] = -(cStack_9c == kEmpty);
            auVar62[0xd] = -(cStack_9b == kEmpty);
            auVar62[0xe] = -(cStack_9a == kEmpty);
            auVar62[0xf] = -(cStack_99 == kEmpty);
            uVar43 = (ushort)(SUB161(auVar62 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar62 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar62 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar62 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar62 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar62 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar62 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar62 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar62 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar62 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar62[0xf] >> 7) << 0xf;
            piVar56 = (iterator *)
                      (this->symbols_by_parent_).
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      .settings_.
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      .value.capacity_;
            local_a8 = pHVar24;
            cStack_a0 = cVar15;
            cStack_9f = cVar16;
            cStack_9e = cVar17;
            cStack_9d = cVar18;
            cStack_9c = cVar19;
            cStack_9b = cVar20;
            cStack_9a = cVar21;
            cStack_99 = cVar22;
            if (uVar43 == 0) {
              if (piVar56 != (iterator *)0x0) goto code_r0x0015491e;
            }
            else if (piVar56 != (iterator *)0x0) {
              pcVar54 = (this->symbols_by_parent_).
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.control;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         *)piVar56);
              aVar45 = local_b0;
              bVar42 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                                 ((size_t)piVar56,(size_t)local_b0,pcVar54);
              if (bVar42) {
                uVar4 = 0xf;
                if (uVar43 != 0) {
                  for (; uVar43 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                  }
                }
                uVar53 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
              }
              else {
                uVar53 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                  }
                }
              }
              target.probe_length =
                   (size_t)absl::lts_20250127::container_internal::
                           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>
                           ::GetPolicyFunctions()::value;
              target.offset = (size_t)local_c0;
              sVar46 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                                 ((container_internal *)this,(CommonFields *)aVar45.slot_,
                                  uVar53 + uVar55 & (ulong)prVar52,target,in_R9);
              goto LAB_00154a4c;
            }
            goto LAB_00154cc0;
          }
LAB_00154cdf:
          __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x14c,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
      }
      goto LAB_00154cc0;
    }
  }
  else {
    AddAliasUnderParent();
  }
  AddAliasUnderParent();
  pHVar24 = local_a8;
LAB_00154cc0:
  local_a8 = pHVar24;
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
               );
code_r0x0015491e:
  uVar55 = (long)&local_c0[1].ctrl_ + uVar55;
  local_c0 = local_c0 + 1;
  if (piVar56 < local_c0) {
    __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf7d,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                 );
  }
  goto LAB_0015487b;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               absl::string_view name,
                                               Symbol symbol) {
  ABSL_DCHECK_EQ(name, symbol.parent_name_key().second);
  ABSL_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}